

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec128.c
# Opt level: O3

void Hacl_Chacha20_Vec128_chacha20_decrypt_128
               (uint32_t len,uint8_t *out,uint8_t *cipher,uint8_t *key,uint8_t *n,uint32_t ctr)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined4 local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  undefined4 local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined4 local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint local_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  undefined4 local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint local_268;
  uint uStack_264;
  undefined8 uStack_260;
  undefined4 local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  uint32_t local_238;
  uint32_t uStack_234;
  uint32_t uStack_230;
  uint32_t uStack_22c;
  uint32_t local_228;
  uint32_t uStack_224;
  uint32_t uStack_220;
  uint32_t uStack_21c;
  uint32_t local_218;
  uint32_t uStack_214;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint32_t local_208;
  uint32_t uStack_204;
  uint32_t uStack_200;
  uint32_t uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  uint32_t local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined4 local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  undefined4 local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined4 local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  undefined4 local_f8;
  uint uStack_f4;
  uint uStack_f0;
  undefined4 local_e8;
  uint uStack_e4;
  uint uStack_e0;
  undefined4 local_d8;
  uint uStack_d4;
  uint uStack_cc;
  undefined4 local_c8;
  uint uStack_c4;
  uint uStack_bc;
  undefined4 local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  undefined4 local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined4 local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined4 local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_1f8 = *(undefined4 *)key;
  local_1e8 = *(undefined4 *)(key + 4);
  local_1d8 = *(undefined4 *)(key + 8);
  local_1c8 = *(undefined4 *)(key + 0xc);
  local_1b8 = *(undefined4 *)(key + 0x10);
  local_1a8 = *(undefined4 *)(key + 0x14);
  local_198 = *(undefined4 *)(key + 0x18);
  local_188 = *(undefined4 *)(key + 0x1c);
  local_168 = *(undefined4 *)n;
  local_158 = *(undefined4 *)(n + 4);
  local_148 = *(undefined4 *)(n + 8);
  local_238 = 0x61707865;
  uStack_234 = 0x61707865;
  uStack_230 = 0x61707865;
  uStack_22c = 0x61707865;
  local_228 = 0x3320646e;
  uStack_224 = 0x3320646e;
  uStack_220 = 0x3320646e;
  uStack_21c = 0x3320646e;
  local_218 = 0x79622d32;
  uStack_214 = 0x79622d32;
  uStack_210 = 0x79622d32;
  uStack_20c = 0x79622d32;
  local_208 = 0x6b206574;
  uStack_204 = 0x6b206574;
  uStack_200 = 0x6b206574;
  uStack_1fc = 0x6b206574;
  iStack_174 = ctr + 1;
  iStack_170 = ctr + 2;
  iStack_16c = ctr + 3;
  uStack_1f4 = local_1f8;
  uStack_1f0 = local_1f8;
  uStack_1ec = local_1f8;
  uStack_1e4 = local_1e8;
  uStack_1e0 = local_1e8;
  uStack_1dc = local_1e8;
  uStack_1d4 = local_1d8;
  uStack_1d0 = local_1d8;
  uStack_1cc = local_1d8;
  uStack_1c4 = local_1c8;
  uStack_1c0 = local_1c8;
  uStack_1bc = local_1c8;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a4 = local_1a8;
  uStack_1a0 = local_1a8;
  uStack_19c = local_1a8;
  uStack_194 = local_198;
  uStack_190 = local_198;
  uStack_18c = local_198;
  uStack_184 = local_188;
  uStack_180 = local_188;
  uStack_17c = local_188;
  local_178 = ctr;
  uStack_164 = local_168;
  uStack_160 = local_168;
  uStack_15c = local_168;
  uStack_154 = local_158;
  uStack_150 = local_158;
  uStack_14c = local_158;
  uStack_144 = local_148;
  uStack_140 = local_148;
  uStack_13c = local_148;
  if (0xff < len) {
    lVar27 = 0xf0;
    uVar28 = 0;
    do {
      memset((Lib_IntVector_Intrinsics_vec128 *)&local_338,0,0x100);
      chacha20_core_128((Lib_IntVector_Intrinsics_vec128 *)&local_338,
                        (Lib_IntVector_Intrinsics_vec128 *)&local_238,(uint32_t)uVar28);
      uVar26 = uStack_27c;
      uVar25 = uStack_280;
      uVar7 = uStack_284;
      uVar24 = uStack_28c;
      uVar17 = uStack_294;
      uVar23 = uStack_29c;
      uVar6 = uStack_2a0;
      uVar22 = uStack_2a4;
      uStack_29c = uStack_2c0;
      uVar5 = uStack_2c4;
      uVar16 = uStack_2d0;
      uVar15 = uStack_2d4;
      uVar21 = uStack_2dc;
      uVar4 = uStack_2e0;
      uStack_2dc = uStack_2e4;
      uVar20 = uStack_2ec;
      uVar13 = uStack_2f0;
      uVar12 = local_338._4_4_;
      uStack_2ec = local_328._4_4_;
      uVar14 = local_318._4_4_;
      uVar3 = local_308._4_4_;
      uStack_28c = uStack_280;
      uStack_2c0 = uStack_274;
      uVar33 = CONCAT44((undefined4)local_328,(undefined4)local_338);
      uVar29 = CONCAT44((undefined4)local_308,(undefined4)local_318);
      uVar18 = CONCAT44((undefined4)uStack_320,(int)uStack_330);
      uVar19 = CONCAT44((undefined4)uStack_300,(int)uStack_310);
      uVar35 = CONCAT44(local_2e8,local_2f8);
      uVar30 = CONCAT44(local_2c8,local_2d8);
      local_378 = (undefined4)local_2b8;
      uStack_374 = (uint)(local_2b8 >> 0x20);
      uStack_2d0 = uStack_374;
      uStack_370 = (uint)uStack_2b0;
      uStack_36c = (uint)(uStack_2b0 >> 0x20);
      uVar34 = CONCAT44(local_2a8,local_378);
      uVar31 = CONCAT44(local_288,local_298);
      uVar36 = CONCAT44(local_268,local_278);
      uStack_27c = uStack_240;
      uVar32 = CONCAT44(local_248,local_258);
      uStack_2f0 = local_338._4_4_;
      local_2e8 = local_318._4_4_;
      uStack_2e4 = local_308._4_4_;
      uStack_2e0 = uStack_2f4;
      local_2d8 = uStack_2d4;
      uStack_2d4 = uStack_2c4;
      uStack_2cc = uStack_2a4;
      local_2c8 = uStack_294;
      uStack_2c4 = uStack_284;
      uStack_2bc = uStack_264;
      local_2a8 = uVar13;
      uStack_2a4 = uVar4;
      uStack_2a0 = uVar16;
      local_298 = uStack_370;
      uStack_294 = uVar6;
      local_288 = uStack_270;
      uStack_284 = (uint)uStack_260;
      uStack_280 = uStack_250;
      uVar11 = *(ulong *)((long)(cipher + lVar27 + -0xf0) + 8);
      *(ulong *)(out + lVar27 + -0xf0) = *(ulong *)(cipher + lVar27 + -0xf0) ^ uVar33;
      *(ulong *)((long)(out + lVar27 + -0xf0) + 8) = uVar11 ^ uVar29;
      uVar11 = *(ulong *)((long)(cipher + lVar27 + -0xe0) + 8);
      *(ulong *)(out + lVar27 + -0xe0) = *(ulong *)(cipher + lVar27 + -0xe0) ^ uVar35;
      *(ulong *)((long)(out + lVar27 + -0xe0) + 8) = uVar11 ^ uVar30;
      uVar11 = *(ulong *)((long)(cipher + lVar27 + -0xd0) + 8);
      *(ulong *)(out + lVar27 + -0xd0) = *(ulong *)(cipher + lVar27 + -0xd0) ^ uVar34;
      *(ulong *)((long)(out + lVar27 + -0xd0) + 8) = uVar11 ^ uVar31;
      uVar11 = *(ulong *)((long)(cipher + lVar27 + -0xc0) + 8);
      *(ulong *)(out + lVar27 + -0xc0) = *(ulong *)(cipher + lVar27 + -0xc0) ^ uVar36;
      *(ulong *)((long)(out + lVar27 + -0xc0) + 8) = uVar11 ^ uVar32;
      uVar8 = *(uint *)(cipher + lVar27 + -0xa4);
      uVar9 = *(uint *)(cipher + lVar27 + -0xa0);
      uVar10 = *(uint *)(cipher + lVar27 + -0x9c);
      *(uint *)(out + lVar27 + -0xa8) = *(uint *)(cipher + lVar27 + -0xa8) ^ local_338._4_4_;
      *(uint *)(out + lVar27 + -0xa4) = uVar8 ^ local_328._4_4_;
      *(uint *)(out + lVar27 + -0xa0) = uVar9 ^ local_318._4_4_;
      *(uint *)(out + lVar27 + -0x9c) = uVar10 ^ local_308._4_4_;
      uVar8 = *(uint *)(cipher + lVar27 + -0x94);
      uVar9 = *(uint *)(cipher + lVar27 + -0x90);
      uVar10 = *(uint *)(cipher + lVar27 + -0x8c);
      *(uint *)(out + lVar27 + -0x98) = *(uint *)(cipher + lVar27 + -0x98) ^ uStack_2f4;
      *(uint *)(out + lVar27 + -0x94) = uVar8 ^ uStack_2dc;
      *(uint *)(out + lVar27 + -0x90) = uVar9 ^ uVar15;
      *(uint *)(out + lVar27 + -0x8c) = uVar10 ^ uVar5;
      uVar8 = *(uint *)(cipher + lVar27 + -0x84);
      uVar9 = *(uint *)(cipher + lVar27 + -0x80);
      uVar10 = *(uint *)(cipher + lVar27 + -0x7c);
      *(uint *)(out + lVar27 + -0x88) = *(uint *)(cipher + lVar27 + -0x88) ^ uStack_374;
      *(uint *)(out + lVar27 + -0x84) = uVar8 ^ uVar22;
      *(uint *)(out + lVar27 + -0x80) = uVar9 ^ uVar17;
      *(uint *)(out + lVar27 + -0x7c) = uVar10 ^ uVar7;
      uVar8 = *(uint *)(cipher + lVar27 + -0x74);
      uVar9 = *(uint *)(cipher + lVar27 + -0x70);
      uVar10 = *(uint *)(cipher + lVar27 + -0x6c);
      *(uint *)(out + lVar27 + -0x78) = *(uint *)(cipher + lVar27 + -0x78) ^ uStack_274;
      *(uint *)(out + lVar27 + -0x74) = uVar8 ^ uStack_264;
      *(uint *)(out + lVar27 + -0x70) = uVar9 ^ uStack_254;
      *(uint *)(out + lVar27 + -0x6c) = uVar10 ^ uStack_244;
      uVar11 = *(ulong *)((long)(cipher + lVar27 + -0x70) + 8);
      *(ulong *)(out + lVar27 + -0x70) = *(ulong *)(cipher + lVar27 + -0x70) ^ uVar18;
      *(ulong *)((long)(out + lVar27 + -0x70) + 8) = uVar11 ^ uVar19;
      puVar1 = (uint *)(cipher + lVar27 + -0x60);
      uVar8 = puVar1[1];
      uVar9 = puVar1[2];
      uVar10 = puVar1[3];
      puVar2 = (uint *)(out + lVar27 + -0x60);
      *puVar2 = *puVar1 ^ uVar13;
      puVar2[1] = uVar8 ^ uVar4;
      puVar2[2] = uVar9 ^ uVar16;
      puVar2[3] = uVar10 ^ uStack_29c;
      puVar1 = (uint *)(cipher + lVar27 + -0x50);
      uVar10 = puVar1[1];
      uVar8 = puVar1[2];
      uVar9 = puVar1[3];
      puVar2 = (uint *)(out + lVar27 + -0x50);
      *puVar2 = *puVar1 ^ uStack_370;
      puVar2[1] = uVar10 ^ uVar6;
      puVar2[2] = uVar8 ^ uStack_290;
      puVar2[3] = uVar9 ^ uVar25;
      puVar1 = (uint *)(cipher + lVar27 + -0x40);
      uVar8 = puVar1[1];
      uVar9 = puVar1[2];
      uVar10 = puVar1[3];
      puVar2 = (uint *)(out + lVar27 + -0x40);
      *puVar2 = *puVar1 ^ uStack_270;
      puVar2[1] = uVar8 ^ (uint)uStack_260;
      puVar2[2] = uVar9 ^ uStack_250;
      puVar2[3] = uVar10 ^ uStack_240;
      uVar8 = *(uint *)(cipher + lVar27 + -0x24);
      uVar9 = *(uint *)(cipher + lVar27 + -0x20);
      uVar10 = *(uint *)(cipher + lVar27 + -0x1c);
      *(uint *)(out + lVar27 + -0x28) = *(uint *)(cipher + lVar27 + -0x28) ^ uStack_330._4_4_;
      *(uint *)(out + lVar27 + -0x24) = uVar8 ^ uStack_320._4_4_;
      *(uint *)(out + lVar27 + -0x20) = uVar9 ^ uStack_310._4_4_;
      *(uint *)(out + lVar27 + -0x1c) = uVar10 ^ uStack_300._4_4_;
      puVar1 = (uint *)(cipher + lVar27 + -0x20);
      uVar8 = puVar1[1];
      uVar9 = puVar1[2];
      uVar10 = puVar1[3];
      puVar2 = (uint *)(out + lVar27 + -0x20);
      *puVar2 = *puVar1 ^ local_358;
      puVar2[1] = uVar8 ^ uStack_354;
      puVar2[2] = uVar9 ^ uVar20;
      puVar2[3] = uVar10 ^ uVar21;
      uVar10 = *(uint *)(cipher + lVar27 + -4);
      uVar8 = *(uint *)(cipher + lVar27);
      uVar9 = *(uint *)(cipher + lVar27 + 4);
      *(uint *)(out + lVar27 + -8) = *(uint *)(cipher + lVar27 + -8) ^ uStack_36c;
      *(uint *)(out + lVar27 + -4) = uVar10 ^ uVar23;
      *(uint *)(out + lVar27) = uVar8 ^ uVar24;
      *(uint *)(out + lVar27 + 4) = uVar9 ^ uVar26;
      uVar8 = *(uint *)(cipher + lVar27 + 0xc);
      uVar9 = *(uint *)(cipher + lVar27 + 0x10);
      uVar10 = *(uint *)(cipher + lVar27 + 0x14);
      *(uint *)(out + lVar27 + 8) = *(uint *)(cipher + lVar27 + 8) ^ uStack_26c;
      *(uint *)(out + lVar27 + 0xc) = uVar8 ^ uStack_260._4_4_;
      *(uint *)(out + lVar27 + 0x10) = uVar9 ^ uStack_24c;
      *(uint *)(out + lVar27 + 0x14) = uVar10 ^ uStack_23c;
      uVar28 = uVar28 + 1;
      lVar27 = lVar27 + 0x100;
      local_338 = uVar33;
      uStack_330 = uVar29;
      local_328 = uVar35;
      uStack_320 = uVar30;
      local_318 = uVar34;
      uStack_310 = uVar31;
      local_308 = uVar36;
      uStack_300 = uVar32;
      local_2b8 = uVar18;
      uStack_2b0 = uVar19;
    } while (len >> 8 != uVar28);
  }
  if ((len & 0xff) != 0) {
    uVar28 = (ulong)(len & 0xff);
    memset((void *)((long)&local_338 + uVar28),0,0x100 - uVar28);
    memcpy(&local_338,cipher + (len & 0xffffff00),uVar28);
    memset((Lib_IntVector_Intrinsics_vec128 *)&local_138,0,0x100);
    chacha20_core_128((Lib_IntVector_Intrinsics_vec128 *)&local_138,
                      (Lib_IntVector_Intrinsics_vec128 *)&local_238,len >> 8);
    local_338 = CONCAT44(local_128,local_138) ^ local_338;
    uStack_330 = CONCAT44(local_108,local_118) ^ uStack_330;
    local_328 = CONCAT44(local_e8,local_f8) ^ local_328;
    uStack_320 = CONCAT44(local_c8,local_d8) ^ uStack_320;
    local_318 = CONCAT44(local_a8,local_b8) ^ local_318;
    uStack_310 = CONCAT44(local_88,local_98) ^ uStack_310;
    local_368 = (undefined4)local_58;
    uStack_364 = (uint)((ulong)local_58 >> 0x20);
    uStack_360 = (uint)uStack_50;
    uStack_35c = (uint)((ulong)uStack_50 >> 0x20);
    local_308 = CONCAT44(local_68,local_78) ^ local_308;
    uStack_300 = CONCAT44(local_48,local_368) ^ uStack_300;
    uStack_2f0 = uStack_134 ^ uStack_2f0;
    uStack_2ec = uStack_124 ^ uStack_2ec;
    local_2e8 = uStack_114 ^ local_2e8;
    uStack_2e4 = uStack_104 ^ uStack_2e4;
    uStack_2e0 = uStack_f4 ^ uStack_2e0;
    uStack_2dc = uStack_e4 ^ uStack_2dc;
    local_2d8 = uStack_d4 ^ local_2d8;
    uStack_2d4 = uStack_c4 ^ uStack_2d4;
    uStack_2d0 = uStack_b4 ^ uStack_2d0;
    uStack_2cc = uStack_a4 ^ uStack_2cc;
    local_2c8 = uStack_94 ^ local_2c8;
    uStack_2c4 = uStack_84 ^ uStack_2c4;
    uStack_2c0 = uStack_74 ^ uStack_2c0;
    uStack_2bc = uStack_64 ^ uStack_2bc;
    local_2b8 = CONCAT44(uStack_120 ^ uStack_44 ^ local_2b8._4_4_,
                         uStack_130 ^ uStack_364 ^ (uint)local_2b8);
    uStack_2b0 = CONCAT44(uStack_100 ^ uStack_2b0._4_4_,uStack_110 ^ (uint)uStack_2b0);
    local_2a8 = uStack_f0 ^ local_2a8;
    uStack_2a4 = uStack_e0 ^ uStack_2a4;
    uStack_2a0 = uStack_cc ^ uStack_2a0;
    uStack_29c = uStack_bc ^ uStack_29c;
    local_298 = uStack_b0 ^ local_298;
    uStack_294 = uStack_a0 ^ uStack_294;
    uStack_290 = uStack_90 ^ uStack_290;
    uStack_28c = uStack_80 ^ uStack_28c;
    local_288 = uStack_70 ^ local_288;
    uStack_284 = uStack_60 ^ uStack_284;
    uStack_280 = uStack_360 ^ uStack_280;
    uStack_27c = uStack_40 ^ uStack_27c;
    uStack_270 = uStack_12c ^ uStack_270;
    uStack_26c = uStack_11c ^ uStack_26c;
    local_268 = uStack_10c ^ local_268;
    uStack_264 = uStack_fc ^ uStack_264;
    uStack_260 = CONCAT44(uStack_bc,uStack_cc) ^ uStack_260;
    uStack_250 = uStack_ac ^ uStack_250;
    uStack_24c = uStack_9c ^ uStack_24c;
    local_248 = uStack_8c ^ local_248;
    uStack_244 = uStack_7c ^ uStack_244;
    uStack_240 = uStack_6c ^ uStack_240;
    uStack_23c = uStack_5c ^ uStack_23c;
    local_238 = uStack_35c ^ local_238;
    uStack_234 = uStack_3c ^ uStack_234;
    memcpy(out + (len & 0xffffff00),&local_338,uVar28);
  }
  return;
}

Assistant:

void
Hacl_Chacha20_Vec128_chacha20_decrypt_128(
  uint32_t len,
  uint8_t *out,
  uint8_t *cipher,
  uint8_t *key,
  uint8_t *n,
  uint32_t ctr
)
{
  KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 ctx[16U] KRML_POST_ALIGN(16) = { 0U };
  chacha20_init_128(ctx, key, n, ctr);
  uint32_t rem = len % 256U;
  uint32_t nb = len / 256U;
  uint32_t rem1 = len % 256U;
  for (uint32_t i = 0U; i < nb; i++)
  {
    uint8_t *uu____0 = out + i * 256U;
    uint8_t *uu____1 = cipher + i * 256U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 k[16U] KRML_POST_ALIGN(16) = { 0U };
    chacha20_core_128(k, ctx, i);
    Lib_IntVector_Intrinsics_vec128 st0 = k[0U];
    Lib_IntVector_Intrinsics_vec128 st1 = k[1U];
    Lib_IntVector_Intrinsics_vec128 st2 = k[2U];
    Lib_IntVector_Intrinsics_vec128 st3 = k[3U];
    Lib_IntVector_Intrinsics_vec128 st4 = k[4U];
    Lib_IntVector_Intrinsics_vec128 st5 = k[5U];
    Lib_IntVector_Intrinsics_vec128 st6 = k[6U];
    Lib_IntVector_Intrinsics_vec128 st7 = k[7U];
    Lib_IntVector_Intrinsics_vec128 st8 = k[8U];
    Lib_IntVector_Intrinsics_vec128 st9 = k[9U];
    Lib_IntVector_Intrinsics_vec128 st10 = k[10U];
    Lib_IntVector_Intrinsics_vec128 st11 = k[11U];
    Lib_IntVector_Intrinsics_vec128 st12 = k[12U];
    Lib_IntVector_Intrinsics_vec128 st13 = k[13U];
    Lib_IntVector_Intrinsics_vec128 st14 = k[14U];
    Lib_IntVector_Intrinsics_vec128 st15 = k[15U];
    Lib_IntVector_Intrinsics_vec128
    v0_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v1_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v2_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v3_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v0__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v1__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v2__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128
    v3__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128 v0__0 = v0__;
    Lib_IntVector_Intrinsics_vec128 v2__0 = v2__;
    Lib_IntVector_Intrinsics_vec128 v1__0 = v1__;
    Lib_IntVector_Intrinsics_vec128 v3__0 = v3__;
    Lib_IntVector_Intrinsics_vec128 v0 = v0__0;
    Lib_IntVector_Intrinsics_vec128 v1 = v1__0;
    Lib_IntVector_Intrinsics_vec128 v2 = v2__0;
    Lib_IntVector_Intrinsics_vec128 v3 = v3__0;
    Lib_IntVector_Intrinsics_vec128
    v0_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v1_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v2_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v3_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v0__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v1__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v2__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128
    v3__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128 v0__2 = v0__1;
    Lib_IntVector_Intrinsics_vec128 v2__2 = v2__1;
    Lib_IntVector_Intrinsics_vec128 v1__2 = v1__1;
    Lib_IntVector_Intrinsics_vec128 v3__2 = v3__1;
    Lib_IntVector_Intrinsics_vec128 v4 = v0__2;
    Lib_IntVector_Intrinsics_vec128 v5 = v1__2;
    Lib_IntVector_Intrinsics_vec128 v6 = v2__2;
    Lib_IntVector_Intrinsics_vec128 v7 = v3__2;
    Lib_IntVector_Intrinsics_vec128
    v0_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v1_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v2_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v3_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v0__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v1__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v2__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128
    v3__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128 v0__4 = v0__3;
    Lib_IntVector_Intrinsics_vec128 v2__4 = v2__3;
    Lib_IntVector_Intrinsics_vec128 v1__4 = v1__3;
    Lib_IntVector_Intrinsics_vec128 v3__4 = v3__3;
    Lib_IntVector_Intrinsics_vec128 v8 = v0__4;
    Lib_IntVector_Intrinsics_vec128 v9 = v1__4;
    Lib_IntVector_Intrinsics_vec128 v10 = v2__4;
    Lib_IntVector_Intrinsics_vec128 v11 = v3__4;
    Lib_IntVector_Intrinsics_vec128
    v0_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v1_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v2_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v3_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v0__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v1__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v2__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128
    v3__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128 v0__6 = v0__5;
    Lib_IntVector_Intrinsics_vec128 v2__6 = v2__5;
    Lib_IntVector_Intrinsics_vec128 v1__6 = v1__5;
    Lib_IntVector_Intrinsics_vec128 v3__6 = v3__5;
    Lib_IntVector_Intrinsics_vec128 v12 = v0__6;
    Lib_IntVector_Intrinsics_vec128 v13 = v1__6;
    Lib_IntVector_Intrinsics_vec128 v14 = v2__6;
    Lib_IntVector_Intrinsics_vec128 v15 = v3__6;
    k[0U] = v0;
    k[1U] = v4;
    k[2U] = v8;
    k[3U] = v12;
    k[4U] = v1;
    k[5U] = v5;
    k[6U] = v9;
    k[7U] = v13;
    k[8U] = v2;
    k[9U] = v6;
    k[10U] = v10;
    k[11U] = v14;
    k[12U] = v3;
    k[13U] = v7;
    k[14U] = v11;
    k[15U] = v15;
    KRML_MAYBE_FOR16(i0,
      0U,
      16U,
      1U,
      Lib_IntVector_Intrinsics_vec128
      x = Lib_IntVector_Intrinsics_vec128_load32_le(uu____1 + i0 * 16U);
      Lib_IntVector_Intrinsics_vec128 y = Lib_IntVector_Intrinsics_vec128_xor(x, k[i0]);
      Lib_IntVector_Intrinsics_vec128_store32_le(uu____0 + i0 * 16U, y););
  }
  if (rem1 > 0U)
  {
    uint8_t *uu____2 = out + nb * 256U;
    uint8_t plain[256U] = { 0U };
    memcpy(plain, cipher + nb * 256U, rem * sizeof (uint8_t));
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 k[16U] KRML_POST_ALIGN(16) = { 0U };
    chacha20_core_128(k, ctx, nb);
    Lib_IntVector_Intrinsics_vec128 st0 = k[0U];
    Lib_IntVector_Intrinsics_vec128 st1 = k[1U];
    Lib_IntVector_Intrinsics_vec128 st2 = k[2U];
    Lib_IntVector_Intrinsics_vec128 st3 = k[3U];
    Lib_IntVector_Intrinsics_vec128 st4 = k[4U];
    Lib_IntVector_Intrinsics_vec128 st5 = k[5U];
    Lib_IntVector_Intrinsics_vec128 st6 = k[6U];
    Lib_IntVector_Intrinsics_vec128 st7 = k[7U];
    Lib_IntVector_Intrinsics_vec128 st8 = k[8U];
    Lib_IntVector_Intrinsics_vec128 st9 = k[9U];
    Lib_IntVector_Intrinsics_vec128 st10 = k[10U];
    Lib_IntVector_Intrinsics_vec128 st11 = k[11U];
    Lib_IntVector_Intrinsics_vec128 st12 = k[12U];
    Lib_IntVector_Intrinsics_vec128 st13 = k[13U];
    Lib_IntVector_Intrinsics_vec128 st14 = k[14U];
    Lib_IntVector_Intrinsics_vec128 st15 = k[15U];
    Lib_IntVector_Intrinsics_vec128
    v0_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v1_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v2_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v3_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v0__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v1__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v2__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128
    v3__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128 v0__0 = v0__;
    Lib_IntVector_Intrinsics_vec128 v2__0 = v2__;
    Lib_IntVector_Intrinsics_vec128 v1__0 = v1__;
    Lib_IntVector_Intrinsics_vec128 v3__0 = v3__;
    Lib_IntVector_Intrinsics_vec128 v0 = v0__0;
    Lib_IntVector_Intrinsics_vec128 v1 = v1__0;
    Lib_IntVector_Intrinsics_vec128 v2 = v2__0;
    Lib_IntVector_Intrinsics_vec128 v3 = v3__0;
    Lib_IntVector_Intrinsics_vec128
    v0_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v1_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v2_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v3_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v0__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v1__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v2__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128
    v3__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128 v0__2 = v0__1;
    Lib_IntVector_Intrinsics_vec128 v2__2 = v2__1;
    Lib_IntVector_Intrinsics_vec128 v1__2 = v1__1;
    Lib_IntVector_Intrinsics_vec128 v3__2 = v3__1;
    Lib_IntVector_Intrinsics_vec128 v4 = v0__2;
    Lib_IntVector_Intrinsics_vec128 v5 = v1__2;
    Lib_IntVector_Intrinsics_vec128 v6 = v2__2;
    Lib_IntVector_Intrinsics_vec128 v7 = v3__2;
    Lib_IntVector_Intrinsics_vec128
    v0_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v1_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v2_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v3_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v0__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v1__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v2__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128
    v3__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128 v0__4 = v0__3;
    Lib_IntVector_Intrinsics_vec128 v2__4 = v2__3;
    Lib_IntVector_Intrinsics_vec128 v1__4 = v1__3;
    Lib_IntVector_Intrinsics_vec128 v3__4 = v3__3;
    Lib_IntVector_Intrinsics_vec128 v8 = v0__4;
    Lib_IntVector_Intrinsics_vec128 v9 = v1__4;
    Lib_IntVector_Intrinsics_vec128 v10 = v2__4;
    Lib_IntVector_Intrinsics_vec128 v11 = v3__4;
    Lib_IntVector_Intrinsics_vec128
    v0_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v1_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v2_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v3_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v0__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v1__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v2__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128
    v3__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128 v0__6 = v0__5;
    Lib_IntVector_Intrinsics_vec128 v2__6 = v2__5;
    Lib_IntVector_Intrinsics_vec128 v1__6 = v1__5;
    Lib_IntVector_Intrinsics_vec128 v3__6 = v3__5;
    Lib_IntVector_Intrinsics_vec128 v12 = v0__6;
    Lib_IntVector_Intrinsics_vec128 v13 = v1__6;
    Lib_IntVector_Intrinsics_vec128 v14 = v2__6;
    Lib_IntVector_Intrinsics_vec128 v15 = v3__6;
    k[0U] = v0;
    k[1U] = v4;
    k[2U] = v8;
    k[3U] = v12;
    k[4U] = v1;
    k[5U] = v5;
    k[6U] = v9;
    k[7U] = v13;
    k[8U] = v2;
    k[9U] = v6;
    k[10U] = v10;
    k[11U] = v14;
    k[12U] = v3;
    k[13U] = v7;
    k[14U] = v11;
    k[15U] = v15;
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      Lib_IntVector_Intrinsics_vec128
      x = Lib_IntVector_Intrinsics_vec128_load32_le(plain + i * 16U);
      Lib_IntVector_Intrinsics_vec128 y = Lib_IntVector_Intrinsics_vec128_xor(x, k[i]);
      Lib_IntVector_Intrinsics_vec128_store32_le(plain + i * 16U, y););
    memcpy(uu____2, plain, rem * sizeof (uint8_t));
  }
}